

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

void skiwi::print_last_global_variable_used
               (ostream *out,shared_ptr<skiwi::environment<skiwi::environment_entry>_> *env,
               repl_data *rd,context *p_ctxt)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *pmVar4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  ostream *poVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  bool bVar9;
  string varname;
  uint64_t ind;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>
  res;
  stringstream ss;
  string local_260;
  repl_data *local_240;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> *local_238;
  long local_230;
  long *local_228;
  long local_220;
  long local_218 [2];
  context *local_208;
  element_type *local_200;
  string local_1f8;
  undefined8 local_1d8;
  _Base_ptr p_Stack_1d0;
  _Base_ptr local_1c8;
  _Base_ptr p_Stack_1c0;
  long *local_1b8 [2];
  long local_1a8 [2];
  undefined8 local_198;
  _Base_ptr p_Stack_190;
  _Base_ptr local_188;
  _Base_ptr p_Stack_180;
  ios_base local_138 [264];
  
  if ((p_ctxt != (context *)0x0) &&
     ((env->
      super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr != (element_type *)0x0)) {
    local_240 = rd;
    local_238 = env;
    local_208 = p_ctxt;
    std::__ostream_insert<char,std::char_traits<char>>(out,"\ncall stack:\n",0xd);
    pmVar4 = &local_240->quote_to_index;
    local_230 = 4;
    do {
      p_Var2 = (_Base_ptr)local_208->last_global_variable_used[local_230];
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      local_1f8._M_string_length = 0;
      local_1f8.field_2._M_local_buf[0] = '\0';
      local_200 = (local_238->
                  super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
      p_Var1 = &(local_200->env)._M_t._M_impl.super__Rb_tree_header;
      for (p_Var6 = *(_Base_ptr *)
                     ((long)&(local_200->env)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
          (_Rb_tree_header *)p_Var6 != p_Var1;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        local_1b8[0] = local_1a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1b8,*(long *)(p_Var6 + 1),
                   (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
        local_198 = *(undefined8 *)(p_Var6 + 2);
        p_Var3 = p_Var6[2]._M_parent;
        local_188 = p_Var6[2]._M_left;
        p_Stack_180 = p_Var6[2]._M_right;
        p_Stack_190 = p_Var3;
        if (local_1b8[0] != local_1a8) {
          operator_delete(local_1b8[0],local_1a8[0] + 1);
        }
        if (p_Var3 == p_Var2) break;
      }
      if ((_Rb_tree_header *)p_Var6 == p_Var1) {
        local_260._M_dataplus._M_p =
             (pointer)(local_200->p_outer).
                      super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
        local_260._M_string_length =
             (size_type)
             (local_200->p_outer).
             super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._M_string_length)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_260._M_string_length)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._M_string_length)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_260._M_string_length)->_M_use_count + 1;
          }
        }
        while ((element_type *)local_260._M_dataplus._M_p != (element_type *)0x0) {
          p_Var6 = (_Rb_tree_node_base *)(local_260._M_dataplus._M_p + 8);
          for (p_Var7 = *(_Rb_tree_node_base **)(local_260._M_dataplus._M_p + 0x18);
              p_Var7 != p_Var6; p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
            local_1b8[0] = local_1a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1b8,*(long *)(p_Var7 + 1),
                       (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
            local_198 = *(undefined8 *)(p_Var7 + 2);
            p_Var3 = p_Var7[2]._M_parent;
            local_188 = p_Var7[2]._M_left;
            p_Stack_180 = p_Var7[2]._M_right;
            p_Stack_190 = p_Var3;
            if (local_1b8[0] != local_1a8) {
              operator_delete(local_1b8[0],local_1a8[0] + 1);
            }
            if (p_Var3 == p_Var2) break;
          }
          if (p_Var7 != (_Rb_tree_node_base *)(local_260._M_dataplus._M_p + 8)) {
            std::__cxx11::string::_M_assign((string *)&local_1f8);
            local_1d8 = *(undefined8 *)(p_Var7 + 2);
            p_Stack_1d0 = p_Var7[2]._M_parent;
            local_1c8 = p_Var7[2]._M_left;
            p_Stack_1c0 = p_Var7[2]._M_right;
            bVar9 = true;
            goto LAB_00248543;
          }
          __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_260._M_dataplus._M_p + 0x38);
          local_260._M_dataplus._M_p =
               (pointer)(((shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)
                         (local_260._M_dataplus._M_p + 0x30))->
                        super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_260._M_string_length,__r);
        }
        bVar9 = false;
LAB_00248543:
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._M_string_length);
        }
        if (bVar9) goto LAB_0024855a;
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_1f8);
        local_1d8 = *(undefined8 *)(p_Var6 + 2);
        p_Stack_1d0 = p_Var6[2]._M_parent;
        local_1c8 = p_Var6[2]._M_left;
        p_Stack_1c0 = p_Var6[2]._M_right;
LAB_0024855a:
        *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 4;
        poVar8 = (ostream *)std::ostream::operator<<(out,(int)local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
        get_variable_name_before_alpha(&local_260,&local_1f8);
        std::__cxx11::string::substr((ulong)local_1b8,(ulong)&local_260);
        iVar5 = std::__cxx11::string::compare((char *)local_1b8);
        if (local_1b8[0] != local_1a8) {
          operator_delete(local_1b8[0],local_1a8[0] + 1);
        }
        if (iVar5 == 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__cxx11::string::substr((ulong)&local_228,(ulong)&local_260);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_228,local_220);
          if (local_228 != local_218) {
            operator_delete(local_228,local_218[0] + 1);
          }
          std::istream::_M_extract<unsigned_long>((ulong *)local_1b8);
          for (p_Var6 = (local_240->quote_to_index)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_left;
              (_Rb_tree_header *)p_Var6 != &(pmVar4->_M_t)._M_impl.super__Rb_tree_header;
              p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
            if (*(long **)(p_Var6 + 2) == local_228) {
              std::__ostream_insert<char,std::char_traits<char>>(out,"(quote ",7);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (out,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,")\n",2);
            }
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
        }
        else {
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,local_260._M_dataplus._M_p,local_260._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,
                        CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                                 local_1f8.field_2._M_local_buf[0]) + 1);
      }
      bVar9 = local_230 != 0;
      local_230 = local_230 + -1;
    } while (bVar9);
  }
  return;
}

Assistant:

void print_last_global_variable_used(std::ostream& out, std::shared_ptr<SKIWI::environment<SKIWI::environment_entry>> env, const repl_data& rd, const context* p_ctxt)
  {
  if (!p_ctxt)
    return;
  if (!env.get())
    return;

  out << "\ncall stack:\n";
  for (int stack_item = SKIWI_VARIABLE_DEBUG_STACK_SIZE - 1; stack_item >= 0; --stack_item)
    {
    uint64_t pos = p_ctxt->last_global_variable_used[stack_item];
    std::pair<std::string, SKIWI::environment_entry> res;
    if (env->find_if(res, [&](const std::pair<std::string, SKIWI::environment_entry>& v) { return v.second.pos == pos; }))
      {
      out << std::setw(4) << stack_item << ": ";
      std::string varname = get_variable_name_before_alpha(res.first);
      if (varname.substr(0, 3) == "#%q")
        {
        std::stringstream ss;
        ss << varname.substr(3);
        uint64_t ind;
        ss >> ind;
        for (const auto& q : rd.quote_to_index)
          {
          if (q.second == ind)
            {
            out << "(quote " << q.first << ")\n";
            }
          }
        }
      else
        out << varname << "\n";
      }
    }
  }